

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O3

void store_message(wchar_t turn,char *msg)

{
  message *pmVar1;
  message *pmVar2;
  char *pcVar3;
  wchar_t wVar4;
  
  pmVar2 = msghistory;
  if (*msg != '\0') {
    wVar4 = L'\0';
    if (histpos + L'\x01' < histsize) {
      wVar4 = histpos + L'\x01';
    }
    pmVar1 = msghistory + wVar4;
    histpos = wVar4;
    msghistory[wVar4].turn = turn;
    if (pmVar2[wVar4].msg != (char *)0x0) {
      free(pmVar2[wVar4].msg);
    }
    pcVar3 = strdup(msg);
    pmVar1->msg = pcVar3;
  }
  return;
}

Assistant:

static void store_message(int turn, const char *msg)
{
    if (!*msg)
	return;
    
    histpos++;
    if (histpos >= histsize)
	histpos = 0;
    
    msghistory[histpos].turn = turn;
    if (msghistory[histpos].msg)
	free(msghistory[histpos].msg);
    msghistory[histpos].msg = strdup(msg);
}